

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_PlayerSelectedWeapon(FParser *this)

{
  bool bVar1;
  AInventory *pAVar2;
  MetaClass *pMVar3;
  FName local_28;
  int local_24;
  PClassActor *pPStack_20;
  int i;
  PClassWeapon *ti;
  int weaponnum;
  int playernum;
  FParser *this_local;
  
  _weaponnum = this;
  bVar1 = CheckArgs(this,1);
  if (!bVar1) {
    return;
  }
  ti._4_4_ = T_GetPlayerNum(this->t_argv);
  if (this->t_argc == 2) {
    ti._0_4_ = intvalue(this->t_argv + 1);
    if (((int)(uint)ti < 0) || (8 < (int)(uint)ti)) {
      script_error("weaponnum out of range! %d\n",(ulong)(uint)ti);
      return;
    }
    pPStack_20 = PClass::FindActor(SF_PlayerSelectedWeapon::WeaponNames[(int)(uint)ti]);
    if (pPStack_20 == (PClassActor *)0x0) {
      script_error("incompatibility in playerweapon %d\n",(ulong)(uint)ti);
      return;
    }
    pAVar2 = AActor::FindInventory((AActor *)(&players)[(long)ti._4_4_ * 0x54],pPStack_20,false);
    *(AInventory **)(&DAT_01ae7198 + (long)ti._4_4_ * 0x2a0) = pAVar2;
  }
  (this->t_return).type = 1;
  local_24 = 0;
  while( true ) {
    if (8 < local_24) {
      return;
    }
    pMVar3 = AWeapon::GetClass(*(AWeapon **)(&DAT_01ae7190 + (long)ti._4_4_ * 0x2a0));
    FName::FName(&local_28,SF_PlayerSelectedWeapon::WeaponNames[local_24]);
    bVar1 = FName::operator==(&(pMVar3->super_PClassInventory).super_PClassActor.super_PClass.
                               super_PNativeStruct.super_PStruct.super_PNamedType.TypeName,&local_28
                             );
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  (this->t_return).value.i = local_24;
  return;
}

Assistant:

void FParser::SF_PlayerSelectedWeapon()
{
	int playernum;
	int weaponnum;


	static const char * const WeaponNames[]={
		"Fist", "Pistol", "Shotgun", "Chaingun", "RocketLauncher", 
		"PlasmaRifle", "BFG9000", "Chainsaw", "SuperShotgun" };


	if (CheckArgs(1))
	{
		playernum=T_GetPlayerNum(t_argv[0]);

		if(t_argc == 2)
		{
			weaponnum = intvalue(t_argv[1]);

			if (weaponnum<0 || weaponnum>=9)
			{
				script_error("weaponnum out of range! %d\n", weaponnum);
				return;
			}
			PClassWeapon * ti = static_cast<PClassWeapon *>(PClass::FindActor(WeaponNames[weaponnum]));
			if (!ti)
			{
				script_error("incompatibility in playerweapon %d\n", weaponnum);
				return;
			}

			players[playernum].PendingWeapon = (AWeapon*)players[playernum].mo->FindInventory(ti);

		} 
		t_return.type = svt_int;
		for(int i=0;i<9;i++)
		{
			if (players[playernum].ReadyWeapon->GetClass ()->TypeName == FName(WeaponNames[i]))
			{
				t_return.value.i=i;
				break;
			}
		}
	}
}